

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash_test.c
# Opt level: O3

void test_id_empty(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  nng_id_map *local_38;
  nng_id_map *m;
  
  nVar1 = nng_id_map_alloc(&local_38,0,0,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash_test.c"
                         ,0x54,"%s: expected success, got %s (%d)","nng_id_map_alloc(&m, 0, 0, 0)",
                         pcVar3,nVar1);
  if (iVar2 != 0) {
    pvVar4 = nng_id_get(local_38,0x2a);
    acutest_check_((uint)(pvVar4 == (void *)0x0),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash_test.c"
                   ,0x56,"%s","nng_id_get(m, 42) == NULL");
    nVar1 = nng_id_remove(local_38,0x2a);
    pcVar3 = nng_strerror(NNG_ENOENT);
    acutest_check_((uint)(nVar1 == NNG_ENOENT),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash_test.c"
                   ,0x57,"%s fails with %s","nng_id_remove(m, 42)",pcVar3);
    pcVar3 = nng_strerror(NNG_ENOENT);
    pcVar5 = nng_strerror(nVar1);
    acutest_message_("%s: expected %s (%d), got %s (%d)","nng_id_remove(m, 42)",pcVar3,0xc,pcVar5,
                     (ulong)nVar1);
    nVar1 = nng_id_remove(local_38,1);
    pcVar3 = nng_strerror(NNG_ENOENT);
    acutest_check_((uint)(nVar1 == NNG_ENOENT),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash_test.c"
                   ,0x58,"%s fails with %s","nng_id_remove(m, 1)",pcVar3);
    pcVar3 = nng_strerror(NNG_ENOENT);
    pcVar5 = nng_strerror(nVar1);
    acutest_message_("%s: expected %s (%d), got %s (%d)","nng_id_remove(m, 1)",pcVar3,0xc,pcVar5,
                     (ulong)nVar1);
    nng_id_map_free(local_38);
    return;
  }
  acutest_abort_();
}

Assistant:

void
test_id_empty(void)
{
	nng_id_map *m;

	NUTS_PASS(nng_id_map_alloc(&m, 0, 0, 0));

	NUTS_TRUE(nng_id_get(m, 42) == NULL);
	NUTS_FAIL(nng_id_remove(m, 42), NNG_ENOENT);
	NUTS_FAIL(nng_id_remove(m, 1), NNG_ENOENT);
	nng_id_map_free(m);
}